

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcm.cpp
# Opt level: O0

int mbedtls_gcm_finish(mbedtls_gcm_context *ctx,uchar *output,size_t output_size,
                      size_t *output_length,uchar *tag,size_t tag_len)

{
  uint uVar1;
  mbedtls_gcm_context *ctx_00;
  uchar *x_00;
  undefined8 *in_RCX;
  long in_RDI;
  void *in_R8;
  ulong in_R9;
  uint64_t orig_add_len;
  uint64_t orig_len;
  uchar work_buf [16];
  uint64_t x_1;
  size_t i_1;
  uint64_t x;
  size_t i;
  uint64_t r_1;
  uint64_t r;
  uint64_t r_3;
  uint64_t r_2;
  undefined8 local_148;
  uint local_140;
  uint local_13c;
  ulong local_138;
  void *local_130;
  long local_110;
  int local_104;
  ulong local_f8;
  ulong local_c0;
  ulong local_b8;
  undefined8 local_b0;
  undefined8 *local_a8;
  long local_a0;
  long local_98;
  ulong local_90;
  ulong *local_88;
  uint local_7c;
  uint *local_78;
  uint local_6c;
  uint *local_68;
  uint local_5c;
  long local_58;
  uint local_4c;
  undefined8 *local_48;
  ulong local_40;
  ulong *local_38;
  ulong local_30;
  ulong *local_28;
  
  *in_RCX = 0;
  ctx_00 = (mbedtls_gcm_context *)(*(long *)(in_RDI + 0x148) << 3);
  x_00 = (uchar *)(*(long *)(in_RDI + 0x150) << 3);
  local_138 = in_R9;
  local_130 = in_R8;
  local_110 = in_RDI;
  if ((*(long *)(in_RDI + 0x148) == 0) && ((*(ulong *)(in_RDI + 0x150) & 0xf) != 0)) {
    gcm_mult(ctx_00,x_00,(uchar *)0x2729dc1);
  }
  if ((local_138 < 0x11) && (3 < local_138)) {
    if ((*(ulong *)(local_110 + 0x148) & 0xf) != 0) {
      gcm_mult(ctx_00,x_00,(uchar *)0x2729e16);
    }
    memcpy(local_130,(void *)(local_110 + 0x158),local_138);
    if ((ctx_00 != (mbedtls_gcm_context *)0x0) || (x_00 != (uchar *)0x0)) {
      memset(&local_148,0,0x10);
      local_48 = &local_148;
      uVar1 = (uint)((ulong)x_00 >> 0x20);
      local_4c = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      local_148._0_4_ = local_4c;
      local_58 = (long)&local_148 + 4;
      uVar1 = (uint)x_00;
      local_5c = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      local_148._4_4_ = local_5c;
      local_68 = &local_140;
      uVar1 = (uint)((ulong)ctx_00 >> 0x20);
      local_6c = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      local_140 = local_6c;
      local_78 = &local_13c;
      uVar1 = (uint)ctx_00;
      local_7c = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      local_13c = local_7c;
      local_98 = local_110 + 0x178;
      local_a0 = local_110 + 0x178;
      local_a8 = &local_148;
      local_b0 = 0x10;
      for (local_b8 = 0; local_b8 + 8 < 0x11; local_b8 = local_b8 + 8) {
        local_28 = (ulong *)(local_a0 + local_b8);
        local_30 = *local_28;
        local_38 = (ulong *)((long)local_a8 + local_b8);
        local_40 = *local_38;
        local_c0 = local_30 ^ local_40;
        local_88 = (ulong *)(local_98 + local_b8);
        *local_88 = local_c0;
        local_90 = local_c0;
      }
      for (; local_b8 < 0x10; local_b8 = local_b8 + 1) {
        *(byte *)(local_98 + local_b8) =
             *(byte *)(local_a0 + local_b8) ^ *(byte *)((long)local_a8 + local_b8);
      }
      gcm_mult(ctx_00,x_00,(uchar *)0x272a0cb);
      for (local_f8 = 0; local_f8 + 8 <= local_138; local_f8 = local_f8 + 8) {
        *(ulong *)((long)local_130 + local_f8) =
             *(ulong *)((long)local_130 + local_f8) ^ *(ulong *)(local_110 + 0x178 + local_f8);
      }
      for (; local_f8 < local_138; local_f8 = local_f8 + 1) {
        *(byte *)((long)local_130 + local_f8) =
             *(byte *)((long)local_130 + local_f8) ^ *(byte *)(local_110 + 0x178 + local_f8);
      }
    }
    local_104 = 0;
  }
  else {
    local_104 = -0x14;
  }
  return local_104;
}

Assistant:

int mbedtls_gcm_finish(mbedtls_gcm_context *ctx,
                       unsigned char *output, size_t output_size,
                       size_t *output_length,
                       unsigned char *tag, size_t tag_len)
{
    unsigned char work_buf[16];
    uint64_t orig_len;
    uint64_t orig_add_len;

    /* We never pass any output in finish(). The output parameter exists only
     * for the sake of alternative implementations. */
    (void) output;
    (void) output_size;
    *output_length = 0;

    /* Total length is restricted to 2^39 - 256 bits, ie 2^36 - 2^5 bytes
     * and AD length is restricted to 2^64 bits, ie 2^61 bytes so neither of
     * the two multiplications would overflow. */
    orig_len = ctx->len * 8;
    orig_add_len = ctx->add_len * 8;

    if (ctx->len == 0 && ctx->add_len % 16 != 0) {
        gcm_mult(ctx, ctx->buf, ctx->buf);
    }

    if (tag_len > 16 || tag_len < 4) {
        return MBEDTLS_ERR_GCM_BAD_INPUT;
    }

    if (ctx->len % 16 != 0) {
        gcm_mult(ctx, ctx->buf, ctx->buf);
    }

    memcpy(tag, ctx->base_ectr, tag_len);

    if (orig_len || orig_add_len) {
        memset(work_buf, 0x00, 16);

        MBEDTLS_PUT_UINT32_BE((orig_add_len >> 32), work_buf, 0);
        MBEDTLS_PUT_UINT32_BE((orig_add_len), work_buf, 4);
        MBEDTLS_PUT_UINT32_BE((orig_len     >> 32), work_buf, 8);
        MBEDTLS_PUT_UINT32_BE((orig_len), work_buf, 12);

        mbedtls_xor(ctx->buf, ctx->buf, work_buf, 16);

        gcm_mult(ctx, ctx->buf, ctx->buf);

        mbedtls_xor(tag, tag, ctx->buf, tag_len);
    }

    return 0;
}